

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void HuffmanTree_cleanup(HuffmanTree *tree)

{
  lodepng_free((void *)0x135ba1);
  lodepng_free((void *)0x135bae);
  lodepng_free((void *)0x135bbb);
  lodepng_free((void *)0x135bc8);
  return;
}

Assistant:

static void HuffmanTree_cleanup(HuffmanTree* tree) {
  lodepng_free(tree->codes);
  lodepng_free(tree->lengths);
  lodepng_free(tree->table_len);
  lodepng_free(tree->table_value);
}